

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

el_action_t ed_move_to_beg(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  int iVar2;
  el_action_t eVar3;
  wchar_t __wc;
  
  (el->el_line).cursor = (el->el_line).buffer;
  eVar3 = '\x05';
  if ((el->el_map).type == L'\x01') {
    __wc = *(el->el_line).cursor;
    while( true ) {
      iVar2 = iswspace(__wc);
      if (iVar2 == 0) break;
      pwVar1 = (el->el_line).cursor;
      (el->el_line).cursor = pwVar1 + 1;
      __wc = pwVar1[1];
    }
    if ((el->el_chared).c_vcmd.action != L'\0') {
      cv_delfini(el);
      eVar3 = '\x04';
    }
  }
  return eVar3;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
ed_move_to_beg(EditLine *el, wint_t c __attribute__((__unused__)))
{

	el->el_line.cursor = el->el_line.buffer;

	if (el->el_map.type == MAP_VI) {
			/* We want FIRST non space character */
		while (iswspace(*el->el_line.cursor))
			el->el_line.cursor++;
		if (el->el_chared.c_vcmd.action != NOP) {
			cv_delfini(el);
			return CC_REFRESH;
		}
	}
	return CC_CURSOR;
}